

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O2

uint Lpk_ComputeSets(Kit_DsdNtk_t *p,Vec_Int_t *vSets)

{
  int iVar1;
  uint uVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  char *__assertion;
  long lVar5;
  
  if (0x10 < p->nVars) {
    __assertion = "p->nVars <= 16";
    uVar4 = 0x70;
LAB_0041be82:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                  ,uVar4,"unsigned int Lpk_ComputeSets(Kit_DsdNtk_t *, Vec_Int_t *)");
  }
  vSets->nSize = 0;
  uVar4 = 0;
  Vec_IntPush(vSets,0);
  pKVar3 = Kit_DsdNtkRoot(p);
  if (((uint)*pKVar3 & 0x1c0) != 0x40) {
    pKVar3 = Kit_DsdNtkRoot(p);
    if (((uint)*pKVar3 & 0x1c0) == 0x80) {
      pKVar3 = Kit_DsdNtkRoot(p);
      iVar1 = Abc_Lit2Var((uint)*(ushort *)(pKVar3 + 1));
      uVar4 = 1 << ((byte)iVar1 & 0x1f);
      Vec_IntPush(vSets,uVar4);
    }
    else {
      uVar4 = Lpk_ComputeSets_rec(p,(uint)p->Root,vSets);
      if (0xffff < uVar4) {
        __assertion = "(uSupport & 0xFFFF0000) == 0";
        uVar4 = 0x7c;
        goto LAB_0041be82;
      }
      Vec_IntPush(vSets,uVar4);
      for (lVar5 = 0; lVar5 < vSets->nSize; lVar5 = lVar5 + 1) {
        uVar2 = Vec_IntEntry(vSets,(int)lVar5);
        if (vSets->nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vSets->pArray[lVar5] = (~uVar2 & uVar4) << 0x10 | uVar2;
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned Lpk_ComputeSets( Kit_DsdNtk_t * p, Vec_Int_t * vSets )
{
    unsigned uSupport, Entry;
    int Number, i;
    assert( p->nVars <= 16 );
    Vec_IntClear( vSets );
    Vec_IntPush( vSets, 0 );
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
        return 0;
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        uSupport = ( 1 << Abc_Lit2Var(Kit_DsdNtkRoot(p)->pFans[0]) );
        Vec_IntPush( vSets, uSupport );
        return uSupport;
    }
    uSupport = Lpk_ComputeSets_rec( p, p->Root, vSets );
    assert( (uSupport & 0xFFFF0000) == 0 );
    Vec_IntPush( vSets, uSupport );
    // set the remaining variables
    Vec_IntForEachEntry( vSets, Number, i )
    {
        Entry = Number;
        Vec_IntWriteEntry( vSets, i, Entry | ((uSupport & ~Entry) << 16) );
    }
    return uSupport;
}